

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

int tinyformat::detail::convertToInt<char[14],_false>::invoke(char (*param_1) [14])

{
  long lVar1;
  format_error *this;
  long in_FS_OFFSET;
  string *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (format_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  format_error::format_error(this,in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
  }
  __stack_chk_fail();
}

Assistant:

static int invoke(const T& /*value*/)
    {
        TINYFORMAT_ERROR("tinyformat: Cannot convert from argument type to "
                         "integer for use as variable width or precision");
        return 0;
    }